

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# return.c
# Opt level: O1

void contextsw(DLword fxnum,DLword bytenum,DLword flags)

{
  LispPTR *pLVar1;
  DLword *pDVar2;
  short sVar3;
  ushort uVar4;
  uint uVar5;
  LispPTR LVar6;
  ushort *puVar7;
  long lVar8;
  undefined6 in_register_0000003a;
  DLword *pDVar9;
  
  if ((flags & 1) == 0) {
    MachineState.pvar[-9] = MachineState.pvar[-9] | 0x100;
  }
  else {
    error("contextswitch sets Incall");
  }
  MachineState.pvar[-6] =
       bytenum + ((short)MachineState.currentpc - (short)MachineState.currentfunc);
  LVar6 = (LispPTR)CONCAT62(in_register_0000003a,fxnum);
  if ((flags & 2) == 0) {
    LVar6 = MachineState.tosvalue;
  }
  pLVar1 = (LispPTR *)(MachineState.csp + 2);
  MachineState.csp = MachineState.csp + 2;
  *pLVar1 = LVar6;
  pDVar9 = MachineState.csp + 2;
  MachineState.csp = pDVar9;
  if (((ulong)pDVar9 & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",pDVar9);
  }
  MachineState.pvar[-5] = (DLword)((uint)((int)pDVar9 - (int)Lisp_world) >> 1);
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
  if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
    error("creating 0-long free stack block.");
  }
  pDVar9 = MachineState.pvar + -10;
  if (((ulong)pDVar9 & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",pDVar9);
  }
  puVar7 = (ushort *)((long)&InterfacePage->resetfxp + (ulong)((uint)fxnum * 2) ^ 2);
  MachineState.pvar = Stackspace + (ulong)*puVar7 + 10;
  *puVar7 = (ushort)((uint)((int)pDVar9 - (int)Lisp_world) >> 1);
  pDVar9 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  if (*(short *)((ulong)pDVar9 ^ 2) != -0x6000) {
    error("contextsw(): MP9316");
  }
  sVar3 = *(short *)((ulong)pDVar9 ^ 2);
  pDVar2 = pDVar9;
  while (sVar3 == -0x6000) {
    pDVar2 = pDVar2 + *(ushort *)((ulong)(pDVar2 + 1) ^ 2);
    MachineState.endofstack = pDVar2;
    sVar3 = *(short *)((ulong)pDVar2 ^ 2);
  }
  uVar4 = MachineState.pvar[-9];
  if ((uVar4 >> 10 & 1) == 0) {
    lVar8 = -4;
    if ((uVar4 >> 8 & 1) != 0) {
      MachineState.pvar[-9] = uVar4 & 0xfaff;
      MachineState.tosvalue = *(LispPTR *)(pDVar9 + -2);
      lVar8 = -8;
    }
    MachineState.csp = (DLword *)((long)pDVar9 + lVar8);
    MachineState.ivar =
         (DLword *)
         ((ulong)((uint)*(ushort *)((ulong)(MachineState.pvar + -0xb) ^ 2) * 2) + (long)Stackspace);
    uVar5 = *(uint *)(MachineState.pvar + -8);
    if ((uVar5 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
    }
    MachineState.currentfunc =
         (fnhead *)((ulong)uVar5 * 2 + CONCAT44(Lisp_world._4_4_,(int)Lisp_world));
    MachineState.currentpc =
         (ByteCode *)((long)&(MachineState.currentfunc)->na + (ulong)MachineState.pvar[-6]);
    return;
  }
  error("return to frame with incall bit ");
  return;
}

Assistant:

void contextsw(DLword fxnum, DLword bytenum, DLword flags)

/* BYTEnum that you want increment PC
      after CONTEXTSW */
/* 0bit(MSB) ON: incall mode */
/* 1bit ON : call from OP_contextsw */
/* I don't know that it is the possible case that
       flags is 3 . */
{
  DLword *next68k;
  DLword *freeptr; /* point to STK to be FSB */

#ifdef TRACE
  printf("contextsw : %d \n", fxnum);
#endif

  if (fxnum != SubovFXP) {
    /* interrupt disable during executing [special] function
      invoked by contextsw(\KEYHANDLER,\RESETSTACK,FAULT)
     */
  }

  if (flags & 1) /* INCALL? */
    error("contextswitch sets Incall");
  else
    CURRENTFX->nopush = T;

  /* store PC */
  CURRENTFX->pc = (UNSIGNED)PC - (UNSIGNED)FuncObj + bytenum;

  /* TOS save */
  if (flags & 2) {
    PushStack(fxnum);
    CurrentStackPTR += 2;
  } else {
    PushCStack;
    CurrentStackPTR += 2;
  }

  CURRENTFX->nextblock = LOLOC(LAddrFromNative(CurrentStackPTR));

  /* FSB set */
  GETWORD(CurrentStackPTR) = STK_FSB_WORD;
  GETWORD(CurrentStackPTR + 1) = (((UNSIGNED)EndSTKP - (UNSIGNED)CurrentStackPTR) >> 1);
  if (0 == GETWORD(CurrentStackPTR + 1)) error("creating 0-long free stack block.");
#ifdef STACKCHECK
  if (EndSTKP < CurrentStackPTR) error("contextsw:Illegal ESP");
#endif

  Midpunt(fxnum); /* exchanging FX */

  next68k = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  if (GETWORD(next68k) != STK_FSB_WORD) error("contextsw(): MP9316");
  freeptr = next68k;

  /* Merging FSB area */
  while (GETWORD(freeptr) == STK_FSB_WORD) EndSTKP = freeptr = freeptr + GETWORD(freeptr + 1);

#ifdef DEBUG
  printf("contextsw:ESTKP set ");
  laddr(EndSTKP);
#endif

  if (CURRENTFX->incall) {
    error("return to frame with incall bit ");
  } else {
    if (CURRENTFX->nopush) {
#ifdef DEBUG
      printf("context:after:nopush \n");
#endif

      CURRENTFX->nopush = NIL;
      CurrentStackPTR = next68k - 2;
      TopOfStack = *((LispPTR *)CurrentStackPTR);
      CurrentStackPTR -= 2;

    } else {
#ifdef DEBUG
      printf("context:after:3 \n");
#endif
      CurrentStackPTR = next68k - 2 /*-1*/; /* CHanged by Hayata */
    }

#ifdef STACKCHECK
    CHECKFX;
    if (EndSTKP < CurrentStackPTR) error("contextsw:Illegal ESP");
#endif
    FastRetCALL;
    return;
  }

}